

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

bool __thiscall capnp::_::ReadLimiter::canRead(ReadLimiter *this,WordCount64 amount,Arena *arena)

{
  ulong uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  uint64_t current;
  Arena *arena_local;
  WordCount64 amount_local;
  ReadLimiter *this_local;
  
  uVar1 = this->limit;
  uVar2 = unbound<unsigned_long>(amount);
  if (uVar2 <= uVar1) {
    uVar3 = unbound<unsigned_long>(amount);
    this->limit = uVar1 - uVar3;
  }
  else {
    (*arena->_vptr_Arena[3])();
  }
  return uVar2 <= uVar1;
}

Assistant:

inline bool ReadLimiter::canRead(WordCount64 amount, Arena* arena) {
  // Be careful not to store an underflowed value into `limit`, even if multiple threads are
  // decrementing it.
  uint64_t current = limit;
  if (KJ_UNLIKELY(unbound(amount / WORDS) > current)) {
    arena->reportReadLimitReached();
    return false;
  } else {
    limit = current - unbound(amount / WORDS);
    return true;
  }
}